

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

bool __thiscall
QWidgetTextControl::canInsertFromMimeData(QWidgetTextControl *this,QMimeData *source)

{
  int *piVar1;
  char cVar2;
  char cVar3;
  undefined1 uVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  long local_88;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  long local_68;
  QArrayData *local_60;
  long local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = *(char *)(*(long *)(this + 8) + 0x111);
  cVar2 = QMimeData::hasText();
  if (cVar3 == '\x01') {
    if (cVar2 == '\0') {
      cVar3 = QMimeData::hasHtml();
      uVar4 = 1;
      if (cVar3 != '\0') goto LAB_004c7300;
LAB_004c7218:
      QVar5.m_data = (storage_type *)0x17;
      QVar5.m_size = (qsizetype)&local_48;
      QString::fromLatin1(QVar5);
      local_78 = local_48;
      uStack_74 = uStack_44;
      uStack_70 = uStack_40;
      uStack_6c = uStack_3c;
      local_68 = local_38;
      cVar3 = (**(code **)(*(long *)source + 0x60))(source);
      uVar4 = 1;
      if (cVar3 == '\0') {
        QVar6.m_data = (storage_type *)0x19;
        QVar6.m_size = (qsizetype)&local_48;
        QString::fromLatin1(QVar6);
        local_98 = local_48;
        uStack_94 = uStack_44;
        uStack_90 = uStack_40;
        uStack_8c = uStack_3c;
        local_88 = local_38;
        uVar4 = (**(code **)(*(long *)source + 0x60))(source,&local_98);
        piVar1 = (int *)CONCAT44(uStack_94,local_98);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_94,local_98),2,0x10);
          }
        }
      }
      piVar1 = (int *)CONCAT44(uStack_74,local_78);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_74,local_78),2,0x10);
        }
      }
      if (cVar2 == '\0') goto LAB_004c7300;
    }
    else {
      QMimeData::text();
      uVar4 = 1;
      if ((local_50 == 0) && (cVar3 = QMimeData::hasHtml(), cVar3 == '\0')) goto LAB_004c7218;
    }
    if (local_60 == (QArrayData *)0x0) goto LAB_004c7300;
    LOCK();
    (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i != 0) goto LAB_004c7300;
  }
  else {
    if (cVar2 == '\0') {
      uVar4 = 0;
      goto LAB_004c7300;
    }
    QMimeData::text();
    uVar4 = local_38 != 0;
    piVar1 = (int *)CONCAT44(uStack_44,local_48);
    if (piVar1 == (int *)0x0) goto LAB_004c7300;
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 != 0) goto LAB_004c7300;
    local_60 = (QArrayData *)CONCAT44(uStack_44,local_48);
  }
  QArrayData::deallocate(local_60,2,0x10);
LAB_004c7300:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (bool)uVar4;
}

Assistant:

bool QWidgetTextControl::canInsertFromMimeData(const QMimeData *source) const
{
    Q_D(const QWidgetTextControl);
    if (d->acceptRichText)
        return (source->hasText() && !source->text().isEmpty())
            || source->hasHtml()
            || source->hasFormat("application/x-qrichtext"_L1)
            || source->hasFormat("application/x-qt-richtext"_L1);
    else
        return source->hasText() && !source->text().isEmpty();
}